

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cpu.cpp
# Opt level: O1

Value __thiscall xmrig::Cpu::toJSON(Cpu *this,Document *doc)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  int iVar1;
  ICpuInfo *pIVar2;
  undefined4 extraout_var;
  size_t sVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined8 extraout_RDX;
  Value VVar4;
  Data local_118;
  Data local_108;
  StringRefType local_f0;
  StringRefType local_e0;
  StringRefType local_d0;
  StringRefType local_c0;
  StringRefType local_b0;
  StringRefType local_a0;
  StringRefType local_90;
  StringRefType local_80;
  StringRefType local_70;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  
  allocator = doc->allocator_;
  pIVar2 = info();
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined2 *)(this + 0xe) = 3;
  (*pIVar2->_vptr_ICpuInfo[2])(pIVar2);
  local_40.s = "brand";
  local_40.length = 5;
  iVar1 = (*pIVar2->_vptr_ICpuInfo[6])(pIVar2);
  local_50.s = (Ch *)CONCAT44(extraout_var,iVar1);
  sVar3 = strlen(local_50.s);
  local_50.length = (SizeType)sVar3;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this,&local_40,&local_50,allocator);
  iVar1 = (*pIVar2->_vptr_ICpuInfo[3])(pIVar2);
  local_118.s.str = (Ch *)0x40500000018da71;
  local_118.n = (Number)0x3;
  local_108.n = (Number)0x0;
  local_108.s.str = (Ch *)((ulong)(ushort)(((ushort)iVar1 & 0xff) + 9) << 0x30);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_118.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_108.s,allocator);
  iVar1 = (*pIVar2->_vptr_ICpuInfo[4])(pIVar2);
  local_118.s.str = (Ch *)0x40500000018d917;
  local_118.n = (Number)0x4;
  local_108.n = (Number)0x0;
  local_108.s.str = (Ch *)((ulong)(ushort)(((ushort)iVar1 & 0xff) + 9) << 0x30);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_118.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_108.s,allocator);
  local_118.s.str = (Ch *)0x40500000018d91c;
  local_118.n = (Number)0x3;
  local_108.n = (Number)0x0;
  local_108.s.str = (Ch *)0xa000000000000;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_118.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_108.s,allocator);
  local_60.s = "l2";
  local_60.length = 2;
  iVar1 = (*pIVar2->_vptr_ICpuInfo[9])(pIVar2);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)this,&local_60,CONCAT44(extraout_var_00,iVar1),allocator);
  local_70.s = "l3";
  local_70.length = 2;
  iVar1 = (*pIVar2->_vptr_ICpuInfo[10])(pIVar2);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)this,&local_70,CONCAT44(extraout_var_01,iVar1),allocator);
  local_80.s = "cores";
  local_80.length = 5;
  iVar1 = (*pIVar2->_vptr_ICpuInfo[8])(pIVar2);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)this,&local_80,CONCAT44(extraout_var_02,iVar1),allocator);
  local_90.s = "threads";
  local_90.length = 7;
  iVar1 = (*pIVar2->_vptr_ICpuInfo[0xd])(pIVar2);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)this,&local_90,CONCAT44(extraout_var_03,iVar1),allocator);
  local_a0.s = "packages";
  local_a0.length = 8;
  iVar1 = (*pIVar2->_vptr_ICpuInfo[0xc])(pIVar2);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)this,&local_a0,CONCAT44(extraout_var_04,iVar1),allocator);
  local_b0.s = "nodes";
  local_b0.length = 5;
  iVar1 = (*pIVar2->_vptr_ICpuInfo[0xb])(pIVar2);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)this,&local_b0,CONCAT44(extraout_var_05,iVar1),allocator);
  local_c0.s = "backend";
  local_c0.length = 7;
  iVar1 = (*pIVar2->_vptr_ICpuInfo[5])(pIVar2);
  local_d0.s = (Ch *)CONCAT44(extraout_var_06,iVar1);
  sVar3 = strlen(local_d0.s);
  local_d0.length = (SizeType)sVar3;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this,&local_c0,&local_d0,allocator);
  local_e0.s = "assembly";
  local_e0.length = 8;
  local_f0.s = "none";
  local_f0.length = 4;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this,&local_e0,&local_f0,allocator);
  VVar4.data_.s.str = (Ch *)extraout_RDX;
  VVar4.data_.n = (Number)this;
  return (Value)VVar4.data_;
}

Assistant:

rapidjson::Value xmrig::Cpu::toJSON(rapidjson::Document &doc)
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    ICpuInfo *i = info();
    Value cpu(kObjectType);
    Assembly assembly(i->assembly());

    cpu.AddMember("brand",      StringRef(i->brand()), allocator);
    cpu.AddMember("aes",        i->hasAES(), allocator);
    cpu.AddMember("avx2",       i->hasAVX2(), allocator);
    cpu.AddMember("x64",        ICpuInfo::isX64(), allocator);
    cpu.AddMember("l2",         static_cast<uint64_t>(i->L2()), allocator);
    cpu.AddMember("l3",         static_cast<uint64_t>(i->L3()), allocator);
    cpu.AddMember("cores",      static_cast<uint64_t>(i->cores()), allocator);
    cpu.AddMember("threads",    static_cast<uint64_t>(i->threads()), allocator);
    cpu.AddMember("packages",   static_cast<uint64_t>(i->packages()), allocator);
    cpu.AddMember("nodes",      static_cast<uint64_t>(i->nodes()), allocator);
    cpu.AddMember("backend",    StringRef(i->backend()), allocator);

    cpu.AddMember("assembly", "none", allocator);

    return cpu;
}